

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Write3dmAnonymousUserTableRecord
          (ON_BinaryArchive *this,ON_UUID plugin_id,int goo_3dm_version,uint goo_opennurbs_version,
          ON_3dmGoo *goo)

{
  ON_UUID plugin_id_00;
  ON_UUID item_id;
  ON_UUID application_id;
  bool bVar1;
  bool local_6d;
  bool rc;
  bool bSavingGoo;
  ON_3dmGoo *goo_local;
  uint goo_opennurbs_version_local;
  int goo_3dm_version_local;
  ON_BinaryArchive *this_local;
  undefined2 uStack_18;
  undefined2 uStack_16;
  ON_UUID plugin_id_local;
  
  plugin_id_local._0_8_ = plugin_id.Data4;
  register0x00000030 = plugin_id._0_8_;
  bVar1 = ON_UuidIsNil((ON_UUID *)((long)&this_local + 4));
  if (bVar1) {
    plugin_id_local.Data4[3] = '\0';
  }
  else {
    application_id.Data4 = (uchar  [8])plugin_id_local._0_8_;
    application_id.Data1 = this_local._4_4_;
    application_id.Data2 = uStack_18;
    application_id.Data3 = uStack_16;
    item_id.Data4 = (uchar  [8])plugin_id_local._0_8_;
    item_id.Data1 = this_local._4_4_;
    item_id.Data2 = uStack_18;
    item_id.Data3 = uStack_16;
    bVar1 = ShouldSerializeUserDataItem(this,application_id,item_id);
    if (bVar1) {
      if (goo_3dm_version < 4) {
        plugin_id_local.Data4[3] = '\0';
      }
      else {
        bVar1 = ON_VersionNumberIsValid(goo_opennurbs_version);
        if ((!bVar1) &&
           (bVar1 = ON_VersionNumberIsYearMonthDateFormat(goo_3dm_version,goo_opennurbs_version),
           !bVar1)) {
          return false;
        }
        if (goo->m_typecode == 0x20000081) {
          if (goo->m_value == 0) {
            plugin_id_local.Data4[3] = '\0';
          }
          else if (goo->m_goo == (uchar *)0x0) {
            plugin_id_local.Data4[3] = '\0';
          }
          else {
            plugin_id_00.Data4 = (uchar  [8])plugin_id_local._0_8_;
            plugin_id_00.Data1 = this_local._4_4_;
            plugin_id_00.Data2 = uStack_18;
            plugin_id_00.Data3 = uStack_16;
            bVar1 = BeginWrite3dmUserTable
                              (this,plugin_id_00,true,goo_3dm_version,goo_opennurbs_version);
            if (bVar1) {
              local_6d = WriteByte(this,(long)goo->m_value,goo->m_goo);
              bVar1 = EndWrite3dmUserTable(this);
              if (!bVar1) {
                local_6d = false;
              }
              plugin_id_local.Data4[3] = local_6d;
            }
            else {
              plugin_id_local.Data4[3] = '\0';
            }
          }
        }
        else {
          plugin_id_local.Data4[3] = '\0';
        }
      }
    }
    else {
      plugin_id_local.Data4[3] = '\0';
    }
  }
  return (bool)plugin_id_local.Data4[3];
}

Assistant:

bool ON_BinaryArchive::Write3dmAnonymousUserTableRecord( 
    ON_UUID plugin_id,
    int goo_3dm_version,
    unsigned int goo_opennurbs_version,
    const ON_3dmGoo& goo
    )
{
  if ( ON_UuidIsNil(plugin_id) )
    return false;
  
  if (false == ShouldSerializeUserDataItem(plugin_id, plugin_id))
    return false;

  if ( goo_3dm_version <= 3 )
    return false;
  if (   !ON_VersionNumberIsValid(goo_opennurbs_version) 
      && !ON_VersionNumberIsYearMonthDateFormat(goo_3dm_version,goo_opennurbs_version)
     )
  {
    return false;
  }
  if ( goo.m_typecode != TCODE_USER_RECORD )
    return false;
  if ( 0 == goo.m_value )
    return false;
  if ( 0 == goo.m_goo )
    return false;
  bool bSavingGoo = true;
  if ( !BeginWrite3dmUserTable( plugin_id, bSavingGoo, goo_3dm_version, goo_opennurbs_version ) )
    return false;
  bool rc = WriteByte( goo.m_value, goo.m_goo );
  if ( !EndWrite3dmUserTable() )
    rc = false;
  return rc;
}